

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict post_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  node_t_conflict arg;
  node_t_conflict r;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  arg = primary_expr(c2m_ctx,no_err_p);
  if (arg == &err_struct) {
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  else {
    c2m_ctx_local = (c2m_ctx_t)post_expr_part(c2m_ctx,no_err_p,arg);
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (post_expr) {
  node_t r;

  P (primary_expr);
  PA (post_expr_part, r);
  return r;
}